

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

size_t __thiscall
spvtools::opt::analysis::ConstantHash::operator()(ConstantHash *this,Constant *const_val)

{
  bool bVar1;
  Type *p;
  long *plVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  char32_t *pcVar3;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *this_01;
  long lVar4;
  size_t sVar5;
  hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_89;
  reference local_88;
  Constant **c;
  const_iterator __end5;
  const_iterator __begin5;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *__range5;
  CompositeConstant *composite;
  uint *w;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  ScalarConstant *scalar;
  u32string h;
  Constant *const_val_local;
  ConstantHash *this_local;
  
  h.field_2._8_8_ = const_val;
  std::__cxx11::u32string::u32string((u32string *)&scalar);
  p = Constant::type((Constant *)h.field_2._8_8_);
  add_pointer(this,(u32string *)&scalar,p);
  plVar2 = (long *)(**(code **)(*(long *)h.field_2._8_8_ + 0x68))();
  if (plVar2 == (long *)0x0) {
    plVar2 = (long *)(**(code **)(*(long *)h.field_2._8_8_ + 0x88))();
    if (plVar2 == (long *)0x0) {
      lVar4 = (**(code **)(*(long *)h.field_2._8_8_ + 0xb0))();
      if (lVar4 == 0) {
        __assert_fail("false && \"Tried to compute the hash value of an invalid Constant instance.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                      ,0x1d7,
                      "size_t spvtools::opt::analysis::ConstantHash::operator()(const Constant *) const"
                     );
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                &scalar,L'\0');
    }
    else {
      this_01 = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 *)(**(code **)(*plVar2 + 0xc0))();
      __end5 = std::
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               ::begin(this_01);
      c = (Constant **)
          std::
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                                         *)&c), bVar1) {
        local_88 = __gnu_cxx::
                   __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                   ::operator*(&__end5);
        add_pointer(this,(u32string *)&scalar,*local_88);
        __gnu_cxx::
        __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
        ::operator++(&__end5);
      }
    }
  }
  else {
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(**(code **)(*plVar2 + 0xc0))()
    ;
    __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    w = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&w), bVar1) {
      pcVar3 = (char32_t *)
               __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end4);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                &scalar,*pcVar3);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end4);
    }
  }
  sVar5 = std::
          hash<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          ::operator()(&local_89,(u32string *)&scalar);
  std::__cxx11::u32string::~u32string((u32string *)&scalar);
  return sVar5;
}

Assistant:

size_t operator()(const Constant* const_val) const {
    std::u32string h;
    add_pointer(&h, const_val->type());
    if (const auto scalar = const_val->AsScalarConstant()) {
      for (const auto& w : scalar->words()) {
        h.push_back(w);
      }
    } else if (const auto composite = const_val->AsCompositeConstant()) {
      for (const auto& c : composite->GetComponents()) {
        add_pointer(&h, c);
      }
    } else if (const_val->AsNullConstant()) {
      h.push_back(0);
    } else {
      assert(
          false &&
          "Tried to compute the hash value of an invalid Constant instance.");
    }

    return std::hash<std::u32string>()(h);
  }